

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

void __thiscall
duckdb::PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator>::Insert
          (PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator> *this,char value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *ppVar3;
  char local_11;
  
  if ((this->full == false) &&
     (local_11 = value, ppVar3 = Lookup(this,&local_11), ppVar3->index == 0xffffffff)) {
    if ((this->size + 1 <= this->maximum_size) &&
       (bVar2 = AddToTarget<signed_char,_0>(this,&local_11), bVar2)) {
      ppVar3->value = local_11;
      iVar1 = this->size;
      this->size = iVar1 + 1;
      ppVar3->index = (uint32_t)iVar1;
      return;
    }
    this->full = true;
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}